

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabBar(char *str_id,ImGuiTabBarFlags flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID key;
  ImGuiTabBar *tab_bar;
  undefined1 auVar3 [16];
  ImRect local_30;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    key = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    tab_bar = ImPool<ImGuiTabBar>::GetOrAddByKey(&pIVar1->TabBars,key);
    local_30.Max.x = (this->WorkRect).Max.x;
    local_30.Min = (this->DC).CursorPos;
    auVar3._8_8_ = 0;
    auVar3._0_4_ = local_30.Min.x;
    auVar3._4_4_ = local_30.Min.y;
    auVar3 = vmovshdup_avx(auVar3);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + pIVar1->FontSize)),
                             ZEXT416((uint)(pIVar1->Style).FramePadding.y),ZEXT416(0x40000000));
    local_30.Max.y = auVar3._0_4_;
    tab_bar->ID = key;
    bVar2 = BeginTabBarEx(tab_bar,&local_30,flags | 0x200000);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool    ImGui::BeginTabBar(const char* str_id, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiID id = window->GetID(str_id);
    ImGuiTabBar* tab_bar = g.TabBars.GetOrAddByKey(id);
    ImRect tab_bar_bb = ImRect(window->DC.CursorPos.x, window->DC.CursorPos.y, window->WorkRect.Max.x, window->DC.CursorPos.y + g.FontSize + g.Style.FramePadding.y * 2);
    tab_bar->ID = id;
    return BeginTabBarEx(tab_bar, tab_bar_bb, flags | ImGuiTabBarFlags_IsFocused);
}